

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.hpp
# Opt level: O2

int __thiscall Centaurus::ATNPath::compare(ATNPath *this,ATNPath *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  pointer ppVar5;
  long lVar6;
  long lVar7;
  
  ppVar5 = (this->
           super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           ).
           super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar2 = -1;
  iVar3 = (int)(((long)(this->
                       super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                       ).
                       super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5) / 0x30);
  iVar1 = (int)(((long)(p->
                       super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                       ).
                       super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(p->
                      super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                      ).
                      super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x30);
  if ((iVar1 <= iVar3) && (iVar2 = 1, iVar3 <= iVar1)) {
    lVar7 = 8;
    lVar6 = -1;
    lVar4 = 0x28;
    do {
      lVar6 = lVar6 + 1;
      if ((int)(((long)(this->
                       super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                       ).
                       super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5) / 0x30) <= lVar6)
      {
        return 0;
      }
      iVar2 = std::__cxx11::wstring::compare
                        ((wstring *)((long)&(ppVar5->first)._vptr_Identifier + lVar7));
      if (iVar2 != 0) {
        return iVar2;
      }
      ppVar5 = (this->
               super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               ).
               super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x30;
      iVar2 = *(int *)((long)&(((p->
                                super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                                ).
                                super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->first)._vptr_Identifier
                      + lVar4);
      iVar1 = *(int *)((long)&(ppVar5->first)._vptr_Identifier + lVar4);
      if (iVar1 < iVar2) {
        return -1;
      }
      lVar4 = lVar4 + 0x30;
    } while (iVar1 <= iVar2);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int compare(const ATNPath& p) const
    {
        if (depth() < p.depth())
        {
            return -1;
        }
        else if (depth() > p.depth())
        {
            return +1;
        }
        else
        {
            for (int i = 0; i < depth(); i++)
            {
                int id_cmp = (*this)[i].first.str().compare(p[i].first.str());

                if (id_cmp != 0) return id_cmp;

                if ((*this)[i].second < p[i].second)
                    return -1;
                else if ((*this)[i].second > p[i].second)
                    return +1;
            }
        }
        return 0;
    }